

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPoolAllocator.h
# Opt level: O3

void * __thiscall cbtPoolAllocator::allocate(cbtPoolAllocator *this,int size)

{
  undefined8 *puVar1;
  
  cbtSpinMutex::lock(&this->m_mutex);
  puVar1 = (undefined8 *)this->m_firstFree;
  if (puVar1 != (undefined8 *)0x0) {
    this->m_firstFree = (void *)*puVar1;
    this->m_freeCount = this->m_freeCount + -1;
  }
  cbtSpinMutex::unlock(&this->m_mutex);
  return puVar1;
}

Assistant:

void* allocate(int size)
	{
		// release mode fix
		(void)size;
		cbtMutexLock(&m_mutex);
		cbtAssert(!size || size <= m_elemSize);
		//cbtAssert(m_freeCount>0);  // should return null if all full
		void* result = m_firstFree;
		if (NULL != m_firstFree)
		{
			m_firstFree = *(void**)m_firstFree;
			--m_freeCount;
		}
		cbtMutexUnlock(&m_mutex);
		return result;
	}